

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

void __thiscall
vkt::ubo::ShaderInterface::getNamedStructs
          (ShaderInterface *this,
          vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
          *structs)

{
  pointer pSVar1;
  StructType *local_28;
  
  for (pSVar1 = (this->m_structs).
                super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar1 != (this->m_structs).
                super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar1 = pSVar1 + 1) {
    local_28 = pSVar1->m_ptr;
    if ((local_28->m_typeName)._M_string_length != 0) {
      std::vector<vkt::ubo::StructType_const*,std::allocator<vkt::ubo::StructType_const*>>::
      emplace_back<vkt::ubo::StructType_const*>
                ((vector<vkt::ubo::StructType_const*,std::allocator<vkt::ubo::StructType_const*>> *)
                 structs,&local_28);
    }
  }
  return;
}

Assistant:

void ShaderInterface::getNamedStructs (std::vector<const StructType*>& structs) const
{
	for (std::vector<StructTypeSP>::const_iterator i = m_structs.begin(); i != m_structs.end(); i++)
	{
		if ((*i)->hasTypeName())
			structs.push_back((*i).get());
	}
}